

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

edge_id * __thiscall merlin::graph::add_edge(graph *this,index i,index j)

{
  pointer peVar1;
  edge_id *peVar2;
  _Elt_pointer puVar3;
  ulong uVar4;
  unsigned_long uVar5;
  ulong uVar6;
  
  peVar2 = edge(this,i,j);
  if ((edge_id::NO_EDGE == peVar2->first) && (DAT_001924d0 == peVar2->second)) {
    puVar3 = (this->m_evacant).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    uVar4 = (long)(this->m_edges).
                  super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->m_edges).
                  super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                  super__Vector_impl_data._M_start >> 5;
    uVar6 = uVar4 & 0xfffffffffffffffe;
    if (puVar3 == (this->m_evacant).c.
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) {
      uVar4 = uVar4 | 1;
      std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>::resize(&this->m_edges,uVar4);
      uVar5 = uVar6;
    }
    else {
      if (puVar3 == (this->m_evacant).c.
                    super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        puVar3 = (this->m_evacant).c.
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      uVar5 = puVar3[-1];
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&(this->m_evacant).c);
      uVar4 = uVar6;
    }
    puVar3 = (this->m_evacant).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar3 == (this->m_evacant).c.
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) {
      std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>::resize
                (&this->m_edges,uVar4 + 1);
    }
    else {
      if (puVar3 == (this->m_evacant).c.
                    super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        puVar3 = (this->m_evacant).c.
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      uVar4 = puVar3[-1];
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&(this->m_evacant).c);
    }
    peVar1 = (this->m_edges).super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
             _M_impl.super__Vector_impl_data._M_start;
    peVar1[uVar5].first = i;
    peVar1[uVar5].second = j;
    peVar1[uVar5].idx = uVar5;
    peVar1[uVar5].ridx = uVar4;
    my_set<merlin::edge_id>::operator|=
              ((this->m_adj).
               super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
               ._M_impl.super__Vector_impl_data._M_start + i,peVar1 + uVar5);
    peVar1 = (this->m_edges).super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
             _M_impl.super__Vector_impl_data._M_start;
    peVar1[uVar4].first = j;
    peVar1[uVar4].second = i;
    peVar1[uVar4].idx = uVar4;
    peVar1[uVar4].ridx = uVar5;
    my_set<merlin::edge_id>::operator|=
              ((this->m_adj).
               super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
               ._M_impl.super__Vector_impl_data._M_start + j,peVar1 + uVar4);
    return (this->m_edges).super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
           _M_impl.super__Vector_impl_data._M_start + uVar5;
  }
  peVar2 = edge(this,i,j);
  return peVar2;
}

Assistant:

const edge_id& add_edge(index i, index j) { // add edges (i,j) and (j,i) to adj
		// std::cout<<"Add edge "<<i<<","<<j<<"\n";
		if (edge(i,j) != edge_id::NO_EDGE)
			return edge(i,j);	// if exists already do nothing

		size_t eij, eji, emax=2*num_edges();	// otherwise get two edge indices
		if (m_evacant.empty()) {
			eij=emax++;
			m_edges.resize(emax);
		} else {
			eij=m_evacant.top();
			m_evacant.pop();
		}
		if (m_evacant.empty()) {
			eji=emax++;
			m_edges.resize(emax);
		} else {
			eji=m_evacant.top();
			m_evacant.pop();
		}

		m_edges[eij] = edge_id(i,j,eij,eji);
		m_adj[i] |= m_edges[eij];
		m_edges[eji] = edge_id(j,i,eji,eij);
		m_adj[j] |= m_edges[eji];

		return m_edges[eij];
	}